

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O0

void __thiscall
duckdb::Prefix::Prefix(Prefix *this,ART *art,Node ptr_p,bool is_mutable,bool set_in_memory)

{
  byte bVar1;
  BlockManager *pBVar2;
  byte in_CL;
  bool dirty;
  IndexPointer in_RDX;
  ART *in_RSI;
  FixedSizeAllocator *in_RDI;
  byte in_R8B;
  NType in_stack_ffffffffffffffbf;
  ART *in_stack_ffffffffffffffc0;
  IndexPointer ptr;
  FixedSizeAllocator *this_00;
  
  dirty = (bool)(in_CL & 1);
  if ((in_R8B & 1) == 0) {
    ptr.data = (idx_t)in_RDI;
    Node::GetAllocator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    pBVar2 = (BlockManager *)FixedSizeAllocator::Get((FixedSizeAllocator *)in_RSI,ptr,dirty);
    in_RDI->block_manager = pBVar2;
  }
  else {
    this_00 = in_RDI;
    Node::GetAllocator(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    pBVar2 = (BlockManager *)FixedSizeAllocator::GetIfLoaded(this_00,in_RDX);
    in_RDI->block_manager = pBVar2;
    if (in_RDI->block_manager == (BlockManager *)0x0) {
      in_RDI->buffer_manager = (BufferManager *)0x0;
      *(undefined1 *)&in_RDI->segment_size = 0;
      return;
    }
  }
  pBVar2 = in_RDI->block_manager;
  bVar1 = Count(in_RSI);
  in_RDI->buffer_manager =
       (BufferManager *)((long)&pBVar2->_vptr_BlockManager + (long)(int)(uint)bVar1 + 1);
  *(undefined1 *)&in_RDI->segment_size = 1;
  return;
}

Assistant:

Prefix::Prefix(const ART &art, const Node ptr_p, const bool is_mutable, const bool set_in_memory) {
	if (!set_in_memory) {
		data = Node::GetAllocator(art, PREFIX).Get(ptr_p, is_mutable);
	} else {
		data = Node::GetAllocator(art, PREFIX).GetIfLoaded(ptr_p);
		if (!data) {
			ptr = nullptr;
			in_memory = false;
			return;
		}
	}
	ptr = reinterpret_cast<Node *>(data + Count(art) + 1);
	in_memory = true;
}